

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgp_client.cpp
# Opt level: O3

bool loop_established(bgp_client_peer *peer)

{
  byte bVar1;
  node<adj_ribs_in_data> *pnVar2;
  bgp_client_peer *pbVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  ssize_t sVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint8_t capability_type;
  int entire_length;
  int remain_byte;
  int append_len;
  int option_type;
  uchar buff [4096];
  byte local_1075;
  uint local_1074;
  bgp_client_peer *local_1070;
  int local_1064;
  int local_1060;
  uint local_105c;
  uint local_1058 [4];
  undefined2 local_1048;
  undefined1 local_1046;
  byte local_1038 [16];
  ushort local_1028;
  byte local_1026;
  uchar local_1025;
  ushort local_1024;
  ushort local_1022;
  uint local_1020;
  byte local_101c;
  byte abStack_101b [4075];
  
  memset(local_1038,0,0x1000);
  uVar6 = recv(peer->sock,local_1038,0x13,0);
  if ((int)uVar6 < 1) {
    return true;
  }
  local_1074 = (uint)(ushort)(local_1028 << 8 | local_1028 >> 8);
  local_1070 = peer;
  log<int>(TRACE,"Receiving %d bytes",(int *)&local_1074);
  uVar8 = 0;
  while( true ) {
    uVar10 = (uint)uVar6;
    if ((int)local_1074 <= (int)uVar10) break;
    while( true ) {
      local_105c = uVar8;
      iVar9 = (int)uVar6;
      local_1064 = local_1074 - iVar9;
      log<int>(TRACE,"%d bytes remain",&local_1064);
      iVar5 = local_1064;
      if (999 < local_1064) {
        iVar5 = 1000;
      }
      sVar7 = recv(local_1070->sock,local_1038 + iVar9,(long)iVar5,0);
      local_1060 = (int)sVar7;
      if (local_1060 < 1) break;
      log<int>(TRACE,"New %d bytes received",&local_1060);
      uVar10 = iVar9 + local_1060;
      uVar6 = (ulong)uVar10;
      uVar8 = local_105c;
      if ((int)local_1074 <= (int)uVar10) goto LAB_00110440;
    }
    uVar8 = local_105c + 1;
    if ((uVar8 & 0xffff) == 0x2711) {
      log<>(ERROR,"Failed to receive packet");
      abort();
    }
  }
LAB_00110440:
  pbVar3 = local_1070;
  switch(local_1026) {
  case 1:
    log<>(INFO,"Open Received");
    log<unsigned_char>(INFO,"Version: %d",&local_1025);
    local_1058[0]._0_2_ = local_1024 << 8 | local_1024 >> 8;
    log<unsigned_short>(INFO,"My AS: %d",(unsigned_short *)local_1058);
    local_1058[0] = CONCAT22(local_1058[0]._2_2_,local_1022 << 8 | local_1022 >> 8);
    log<unsigned_short>(INFO,"Hold Time: %d",(unsigned_short *)local_1058);
    local_1058[0] =
         local_1020 >> 0x18 | (local_1020 & 0xff0000) >> 8 | (local_1020 & 0xff00) << 8 |
         local_1020 << 0x18;
    log<unsigned_int>(INFO,"BGP Id: %d",local_1058);
    log<unsigned_char>(INFO,"Opt Length: %d",&local_101c);
    if (local_1070->remote_as != (uint)(ushort)(local_1024 << 8 | local_1024 >> 8)) {
      send_notification(&local_1070->super_bgp_peer,'\x02',2);
      return false;
    }
    if (local_101c != 0) {
      iVar5 = 0x1d;
      do {
        local_1058[0] = (uint)local_1038[iVar5];
        if (local_1058[0] == 2) {
          local_1075 = local_1038[(long)iVar5 + 2];
          bVar1 = local_1038[(long)iVar5 + 3];
          log<unsigned_char>(INFO,"Capability type : %d",&local_1075);
          if (local_1075 == 0x41) {
            (local_1070->super_bgp_peer).is_4_octet_as_supported = true;
            log<>(INFO,"Supported 4-octet AS number!");
          }
          iVar5 = iVar5 + (uint)bVar1 + 4;
        }
        else {
          log<int>(INFO,"Option type : %d",(int *)local_1058);
          iVar5 = iVar5 + 2;
        }
      } while (iVar5 < (int)(local_101c + 0x1d));
    }
    (local_1070->super_bgp_peer).bgp_id =
         local_1020 >> 0x18 | (local_1020 & 0xff0000) >> 8 | (local_1020 & 0xff00) << 8 |
         local_1020 << 0x18;
    bVar4 = send_open(&local_1070->super_bgp_peer);
    if (bVar4) {
      return true;
    }
    break;
  case 2:
    log<>(INFO,"Update received");
    bgp_update(&local_1070->super_bgp_peer,local_1038,local_1074);
    return true;
  case 3:
    log<>(NOTICE,"Notification received");
    log<unsigned_char>(NOTICE,"Error: %d",&local_1025);
    log<unsigned_char>(NOTICE,"Sub: %d",(uchar *)&local_1024);
    return false;
  case 4:
    if ((local_1070->super_bgp_peer).state == '\x04') {
      pnVar2 = (local_1070->super_bgp_peer).adj_ribs_in;
      pnVar2->is_prefix = true;
      pnVar2->prefix = 0;
      pnVar2->prefix_len = '\0';
      pnVar2->data = (adj_ribs_in_data *)0x0;
      pnVar2->parent = (node<adj_ribs_in_data> *)0x0;
      pnVar2->node_0 = (node<adj_ribs_in_data> *)0x0;
      pnVar2->node_1 = (node<adj_ribs_in_data> *)0x0;
      (local_1070->super_bgp_peer).state = '\x05';
    }
    log<>(INFO,"Keepalive Received");
    local_1058[0] = 0xffffffff;
    local_1058[1] = 0xffffffff;
    local_1058[2] = 0xffffffff;
    local_1058[3] = 0xffffffff;
    local_1048 = 0x1300;
    local_1046 = 4;
    iVar5 = (**(pbVar3->super_bgp_peer)._vptr_bgp_peer)(pbVar3,local_1058,(long)(int)uVar10);
    if ((char)iVar5 != '\0') {
      return true;
    }
    break;
  default:
    log<unsigned_char>(ERROR,"Unknown type received %d",&local_1026);
    return true;
  }
  log<>(ERROR,"Failed to send packet");
  return false;
}

Assistant:

bool loop_established(bgp_client_peer* peer){
    int len;
    unsigned char buff[4096];
    //printf("\e[m");
    memset(buff, 0x00, 4096);
    len = recv(peer->sock, &buff, 19, 0);
    if(len <= 0){
        return true;
    }
    auto* bgphp = reinterpret_cast<bgp_header*>(buff);

    // hex_dump(buff, 29); // dump header
    int entire_length = ntohs(bgphp->length);
    log(log_level::TRACE, "Receiving %d bytes", entire_length);

    int append_len, remain_byte;
    uint16_t error = 0;
    while(len < entire_length){
        remain_byte = entire_length - len;
        log(log_level::TRACE, "%d bytes remain", remain_byte);
        append_len = recv(peer->sock, &buff[len], std::min(remain_byte, 1000), 0);
        if(append_len <= 0){
            if(++error > 10000){
                log(log_level::ERROR, "Failed to receive packet");
                abort();
            }
            continue;
        }
        log(log_level::TRACE, "New %d bytes received", append_len);
        len += append_len;
    }

    switch(bgphp->type){
        case OPEN:{
            log(log_level::INFO, "Open Received");
            auto* bgpopp = reinterpret_cast<bgp_open*>(buff);
            log(log_level::INFO, "Version: %d", bgpopp->version);
            log(log_level::INFO, "My AS: %d", ntohs(bgpopp->my_as));
            log(log_level::INFO, "Hold Time: %d", ntohs(bgpopp->hold_time));
            log(log_level::INFO, "BGP Id: %d", ntohl(bgpopp->bgp_id));
            log(log_level::INFO, "Opt Length: %d", bgpopp->opt_length);

            if(ntohs(bgpopp->my_as) != peer->remote_as){
                send_notification(peer, bgp_error_code::OPEN_MESSAGE_ERROR, bgp_error_sub_code_open::BAD_PEER_AS);
                return false;
            }

            int read_length = 29;
            while(read_length < 29 + bgpopp->opt_length){
                int option_type = buff[read_length];
                read_length++;
                int option_length = buff[read_length];
                read_length++;
                switch(option_type){
                    case bgp_open_optional_parameter_type::CAPABILITIES:{
                        uint8_t capability_type = buff[read_length];
                        read_length++;
                        uint8_t capability_length = buff[read_length];
                        read_length++;
                        read_length += capability_length;
                        log(log_level::INFO, "Capability type : %d", capability_type);
                        switch(capability_type){
                            case bgp_capability_code::MULTIPROTOCOL_EXTENSION_FOR_BGP4:
                                break;
                            case bgp_capability_code::SUPPORT_FOR_4_OCTET_AS_NUMBER_CAPABILITY:
                                peer->is_4_octet_as_supported = true;
                                log(log_level::INFO, "Supported 4-octet AS number!");
                                break;
                        }
                    }
                        break;
                    default:
                        log(log_level::INFO, "Option type : %d", option_type);
                        break;
                }
            }
            peer->bgp_id = ntohl(bgpopp->bgp_id);

            if(!send_open(peer)){
                log(log_level::ERROR, "Failed to send packet");
                return false;
            }
        }
            break;
        case UPDATE:{
            log(log_level::INFO, "Update received");
            bgp_update(peer, buff, entire_length);
        }
            break;
        case NOTIFICATION:{
            log(log_level::NOTICE, "Notification received");
            auto* bgpntp = reinterpret_cast<bgp_notification*>(buff);
            log(log_level::NOTICE, "Error: %d", bgpntp->error);
            log(log_level::NOTICE, "Sub: %d", bgpntp->error_sub);
            return false;
        }
        case KEEPALIVE:{
            if(peer->state == OPEN_CONFIRM){
                peer->adj_ribs_in->is_prefix = true;
                peer->adj_ribs_in->prefix = 0;
                peer->adj_ribs_in->prefix_len = 0;
                peer->adj_ribs_in->data = nullptr;
                peer->adj_ribs_in->parent = nullptr;
                peer->adj_ribs_in->node_0 = nullptr;
                peer->adj_ribs_in->node_1 = nullptr;
                peer->state = ESTABLISHED;
            }
            log(log_level::INFO, "Keepalive Received");
            bgp_header header;
            memset(header.maker, 0xff, 16);
            header.length = htons(19);
            header.type = KEEPALIVE;
            if(!peer->send(&header, len)){
                log(log_level::ERROR, "Failed to send packet");
                return false;
            }
        }
            break;
        default:
            log(log_level::ERROR, "Unknown type received %d", bgphp->type);
            break;
    }
    return true;
}